

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O1

bool __thiscall
ON_OBSOLETE_V5_DimAngular::CreateFromPoints
          (ON_OBSOLETE_V5_DimAngular *this,ON_3dPoint *pc,ON_3dPoint *p0in,ON_3dPoint *p1in,
          ON_3dPoint *arcpt,ON_3dVector *Normal)

{
  ON_2dPointArray *this_00;
  double *t;
  int iVar1;
  ON_2dPoint *pOVar2;
  double dVar3;
  ON_3dPoint p;
  ON_3dPoint p_00;
  ON_3dPoint p_01;
  ON_3dPoint p_02;
  ON_3dPoint p_03;
  bool bVar4;
  ON_3dVector *pOVar5;
  ON_AngularDimension2Extra *pOVar6;
  long lVar7;
  ON_Plane *pOVar8;
  ON_Plane *pOVar9;
  byte bVar10;
  double a1;
  ON_2dVector v0;
  ON_2dPoint pp1;
  ON_2dPoint pp0;
  ON_2dPoint pa;
  double aa;
  ON_3dPoint p0;
  ON_3dPoint p1;
  ON_Plane plane;
  ON_2dVector local_168;
  double local_158;
  ON_2dVector local_150;
  ON_2dPoint local_140;
  double local_130;
  double local_128;
  ON_2dPoint local_120;
  ON_2dPoint local_110;
  double local_100;
  double local_f8;
  double dStack_f0;
  double local_e8;
  double local_d8;
  double dStack_d0;
  double local_c8;
  ON_2dVector local_b8;
  ON_Plane local_a8;
  
  bVar10 = 0;
  local_f8 = p0in->x;
  dStack_f0 = p0in->y;
  local_e8 = p0in->z;
  local_d8 = p1in->x;
  dStack_d0 = p1in->y;
  local_c8 = p1in->z;
  ON_Plane::ON_Plane(&local_a8,pc,Normal);
  t = &local_120.y;
  p.y = dStack_f0;
  p.x = local_f8;
  p.z = local_e8;
  bVar4 = ON_Plane::ClosestPointTo(&local_a8,p,&local_120.x,t);
  if (bVar4) {
    ON_2dVector::ON_2dVector(&local_150,&local_120);
    ON_2dVector::Unitize(&local_150);
    bVar4 = ON_2dVector::IsValid(&local_150);
    if (bVar4) {
      bVar4 = ON_2dVector::IsNotZero(&local_150);
      if (bVar4) {
        local_128 = local_150.x;
        local_130 = local_150.y;
        pOVar5 = ON_Plane::Normal(&local_a8);
        ON_Plane::Rotate(&local_a8,local_130,local_128,pOVar5);
      }
    }
    p_00.y = dStack_f0;
    p_00.x = local_f8;
    p_00.z = local_e8;
    bVar4 = ON_Plane::ClosestPointTo(&local_a8,p_00,&local_120.x,t);
    if (bVar4) {
      bVar4 = ON_Plane::ClosestPointTo(&local_a8,*arcpt,&local_110.x,&local_110.y);
      if (bVar4) {
        p_01.y = dStack_d0;
        p_01.x = local_d8;
        p_01.z = local_c8;
        bVar4 = ON_Plane::ClosestPointTo(&local_a8,p_01,&local_140.x,&local_140.y);
        if (bVar4) {
          local_158 = ON_DBL_QNAN;
          local_100 = ON_DBL_QNAN;
          ON_2dVector::ON_2dVector(&local_168,&local_140);
          bVar4 = VectorAngle(&local_168,&local_158);
          if (bVar4) {
            ON_2dVector::ON_2dVector(&local_b8,&local_110);
            bVar4 = VectorAngle(&local_b8,&local_100);
            if (bVar4) {
              if (local_100 <= local_158) {
LAB_004ae143:
                ON_2dVector::ON_2dVector(&local_168,&local_140);
                VectorAngle(&local_168,&local_158);
                this->m_angle = local_158;
                ON_2dVector::ON_2dVector(&local_168,&local_110);
                dVar3 = ON_2dVector::Length(&local_168);
                this->m_radius = dVar3;
                pOVar6 = ON_AngularDimension2Extra::AngularDimensionExtra(this);
                if (pOVar6 != (ON_AngularDimension2Extra *)0x0) {
                  ON_2dVector::ON_2dVector(&local_168,&local_120);
                  dVar3 = ON_2dVector::Length(&local_168);
                  pOVar6->m_dimpoint_offset[0] = dVar3;
                  ON_2dVector::ON_2dVector(&local_168,&local_140);
                  dVar3 = ON_2dVector::Length(&local_168);
                  pOVar6->m_dimpoint_offset[1] = dVar3;
                }
                this_00 = &(this->super_ON_OBSOLETE_V5_Annotation).m_points;
                ON_SimpleArray<ON_2dPoint>::SetCapacity
                          (&this_00->super_ON_SimpleArray<ON_2dPoint>,4);
                if (3 < (this->super_ON_OBSOLETE_V5_Annotation).m_points.
                        super_ON_SimpleArray<ON_2dPoint>.m_capacity) {
                  (this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>.
                  m_count = 4;
                }
                pOVar8 = &local_a8;
                pOVar9 = &(this->super_ON_OBSOLETE_V5_Annotation).m_plane;
                for (lVar7 = 0x10; lVar7 != 0; lVar7 = lVar7 + -1) {
                  (pOVar9->origin).x = (pOVar8->origin).x;
                  pOVar8 = (ON_Plane *)((long)pOVar8 + ((ulong)bVar10 * -2 + 1) * 8);
                  pOVar9 = (ON_Plane *)((long)pOVar9 + (ulong)bVar10 * -0x10 + 8);
                }
                iVar1 = (this->super_ON_OBSOLETE_V5_Annotation).m_points.
                        super_ON_SimpleArray<ON_2dPoint>.m_count;
                if (iVar1 < 2) {
                  if (iVar1 == 1) {
                    ON_SimpleArray<ON_2dPoint>::Append
                              (&this_00->super_ON_SimpleArray<ON_2dPoint>,&local_120);
                  }
                }
                else {
                  pOVar2 = (this->super_ON_OBSOLETE_V5_Annotation).m_points.
                           super_ON_SimpleArray<ON_2dPoint>.m_a;
                  pOVar2[1].x = local_120.x;
                  pOVar2[1].y = local_120.y;
                }
                iVar1 = (this->super_ON_OBSOLETE_V5_Annotation).m_points.
                        super_ON_SimpleArray<ON_2dPoint>.m_count;
                if (iVar1 < 3) {
                  if (iVar1 == 2) {
                    ON_SimpleArray<ON_2dPoint>::Append
                              (&this_00->super_ON_SimpleArray<ON_2dPoint>,&local_140);
                  }
                }
                else {
                  pOVar2 = (this->super_ON_OBSOLETE_V5_Annotation).m_points.
                           super_ON_SimpleArray<ON_2dPoint>.m_a;
                  pOVar2[2].x = local_140.x;
                  pOVar2[2].y = local_140.y;
                }
                iVar1 = (this->super_ON_OBSOLETE_V5_Annotation).m_points.
                        super_ON_SimpleArray<ON_2dPoint>.m_count;
                if (iVar1 < 4) {
                  bVar4 = true;
                  if (iVar1 == 3) {
                    ON_SimpleArray<ON_2dPoint>::Append
                              (&this_00->super_ON_SimpleArray<ON_2dPoint>,&local_110);
                  }
                }
                else {
                  pOVar2 = (this->super_ON_OBSOLETE_V5_Annotation).m_points.
                           super_ON_SimpleArray<ON_2dPoint>.m_a;
                  pOVar2[3].x = local_110.x;
                  pOVar2[3].y = local_110.y;
                  bVar4 = true;
                }
                goto LAB_004ae240;
              }
              ON_2dVector::Set(&local_150,local_140.x,local_140.y);
              ON_2dVector::Unitize(&local_150);
              local_128 = local_150.x;
              local_130 = local_150.y;
              pOVar5 = ON_Plane::Normal(&local_a8);
              ON_Plane::Rotate(&local_a8,local_130,local_128,pOVar5);
              bVar4 = ON_Plane::ClosestPointTo(&local_a8,*arcpt,&local_110.x,&local_110.y);
              if (bVar4) {
                p_02.y = dStack_d0;
                p_02.x = local_d8;
                p_02.z = local_c8;
                bVar4 = ON_Plane::ClosestPointTo(&local_a8,p_02,&local_120.x,t);
                if (bVar4) {
                  p_03.y = dStack_f0;
                  p_03.x = local_f8;
                  p_03.z = local_e8;
                  bVar4 = ON_Plane::ClosestPointTo(&local_a8,p_03,&local_140.x,&local_140.y);
                  if (bVar4) goto LAB_004ae143;
                }
              }
            }
          }
        }
      }
    }
  }
  bVar4 = false;
LAB_004ae240:
  ON_Plane::~ON_Plane(&local_a8);
  return bVar4;
}

Assistant:

bool ON_OBSOLETE_V5_DimAngular::CreateFromPoints( 
            const ON_3dPoint& pc, 
            const ON_3dPoint& p0in,
            const ON_3dPoint& p1in,
            ON_3dPoint& arcpt, 
            ON_3dVector& Normal)
{
  ON_3dPoint p0, p1;
  p0 = p0in;
  p1 = p1in;

  ON_Plane plane( pc, Normal);

  ON_2dPoint pa, pp0, pp1;

  if( !plane.ClosestPointTo( p0, &pp0.x, &pp0.y))
    return false;

  // rotate so that p0 is on x-axis
  ON_2dVector v0( pp0);
  v0.Unitize();
  if ( v0.IsValid() && v0.IsNotZero() )
    plane.Rotate( v0.y, v0.x, plane.Normal());

  if( !plane.ClosestPointTo( p0, &pp0.x, &pp0.y))
    return false;

  if( !plane.ClosestPointTo( arcpt, &pa.x, &pa.y))
    return false;

  if( !plane.ClosestPointTo( p1, &pp1.x, &pp1.y))
    return false;

  double a1 = ON_DBL_QNAN;
  double aa = ON_DBL_QNAN;
  if( !VectorAngle( ON_2dVector( pp1), a1) || !VectorAngle( ON_2dVector( pa), aa))    
    return false;

  if( aa > a1)  // the angle is really the bigger one ( > 180)
  {
    // rotate so that p0 is on x-axis
    v0.Set( pp1.x, pp1.y);
    v0.Unitize();
    plane.Rotate( v0.y, v0.x, plane.Normal());

    if( !plane.ClosestPointTo( arcpt, &pa.x, &pa.y))
      return false;
    if( !plane.ClosestPointTo( p1, &pp0.x, &pp0.y))
      return false;
    if( !plane.ClosestPointTo( p0, &pp1.x, &pp1.y))
      return false;
  }

  VectorAngle( ON_2dVector( pp1), a1);

  SetAngle( a1);
  SetRadius( ON_2dVector( pa).Length());

  ON_AngularDimension2Extra* pDE = ON_AngularDimension2Extra::AngularDimensionExtra(this);
  if(pDE != 0)
  {
    double os = ((ON_2dVector)pp0).Length();
    pDE->SetDimpointOffset(0, os);
    os = ((ON_2dVector)pp1).Length();
    pDE->SetDimpointOffset(1, os);
  }

  ReservePoints( 4);
  SetPlane( plane);
  SetPoint( 1, pp0);
  SetPoint( 2, pp1);
  SetPoint( 3, pa);


  return true;
}